

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O0

string * __thiscall NullBackendFactory::probe_abi_cxx11_(NullBackendFactory *this,BackendType type)

{
  int in_EDX;
  string *in_RDI;
  string *outnames;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (in_EDX == 0) {
    std::__cxx11::string::append((char *)in_RDI,0x2723bf);
  }
  return in_RDI;
}

Assistant:

std::string NullBackendFactory::probe(BackendType type)
{
    std::string outnames;
    switch(type)
    {
    case BackendType::Playback:
        /* Includes null char. */
        outnames.append(nullDevice, sizeof(nullDevice));
        break;
    case BackendType::Capture:
        break;
    }
    return outnames;
}